

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *in_RSI;
  void *in_RDI;
  bool bVar4;
  int ret;
  secp256k1_gej b2;
  secp256k1_gej a2;
  uint local_114;
  secp256k1_fe local_110;
  secp256k1_fe sStack_e8;
  secp256k1_fe sStack_c0;
  secp256k1_fe local_90;
  secp256k1_fe sStack_68;
  secp256k1_fe sStack_40;
  void *local_10;
  
  bVar4 = *(int *)((long)in_RDI + 0x78) == *(int *)((long)in_RSI + 0x78);
  local_114 = (uint)bVar4;
  if ((local_114 != 0) && (*(int *)((long)in_RDI + 0x78) == 0)) {
    local_10 = in_RSI;
    memcpy(&local_90,in_RDI,0x80);
    memcpy(&local_110,local_10,0x80);
    secp256k1_fe_impl_normalize(&local_90);
    secp256k1_fe_impl_normalize(&sStack_68);
    secp256k1_fe_impl_normalize(&sStack_40);
    secp256k1_fe_impl_normalize(&local_110);
    secp256k1_fe_impl_normalize(&sStack_e8);
    secp256k1_fe_impl_normalize(&sStack_c0);
    iVar1 = secp256k1_fe_impl_cmp_var(&local_90,&local_110);
    iVar2 = secp256k1_fe_impl_cmp_var(&sStack_68,&sStack_e8);
    iVar3 = secp256k1_fe_impl_cmp_var(&sStack_40,&sStack_c0);
    local_114 = (uint)(iVar3 == 0 && (iVar2 == 0 && (iVar1 == 0 && bVar4)));
  }
  return local_114;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}